

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.hpp
# Opt level: O0

void __thiscall
Diligent::CommandQueueVkImpl::SetFence
          (CommandQueueVkImpl *this,RefCntAutoPtr<Diligent::FenceVkImpl> *pFence)

{
  bool bVar1;
  FenceVkImpl *pFVar2;
  FenceDesc *pFVar3;
  Char *pCVar4;
  char (*in_RCX) [51];
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  RefCntAutoPtr<Diligent::FenceVkImpl> *pFence_local;
  CommandQueueVkImpl *this_local;
  
  msg.field_2._8_8_ = pFence;
  pFVar2 = RefCntAutoPtr<Diligent::FenceVkImpl>::operator->(pFence);
  pFVar3 = DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>::
           GetDesc((DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                    *)pFVar2);
  if (pFVar3->Type != FENCE_TYPE_CPU_WAIT_ONLY) {
    FormatString<char[26],char[51]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pFence->GetDesc().Type == FENCE_TYPE_CPU_WAIT_ONLY",in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [51])0x93;
    DebugAssertionFailed
              (pCVar4,"SetFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/CommandQueueVkImpl.hpp"
               ,0x93);
    std::__cxx11::string::~string((string *)local_38);
  }
  pFVar2 = RefCntAutoPtr<Diligent::FenceVkImpl>::operator->(pFence);
  bVar1 = FenceVkImpl::IsTimelineSemaphore(pFVar2);
  if (bVar1) {
    FormatString<char[26],char[31]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!pFence->IsTimelineSemaphore()",(char (*) [31])in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"SetFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/CommandQueueVkImpl.hpp"
               ,0x94);
    std::__cxx11::string::~string((string *)local_68);
  }
  RefCntAutoPtr<Diligent::FenceVkImpl>::operator=(&this->m_pFence,pFence);
  return;
}

Assistant:

void SetFence(RefCntAutoPtr<FenceVkImpl> pFence)
    {
        VERIFY_EXPR(pFence->GetDesc().Type == FENCE_TYPE_CPU_WAIT_ONLY);
        VERIFY_EXPR(!pFence->IsTimelineSemaphore());
        m_pFence = std::move(pFence);
    }